

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmListFileContext * __thiscall
cmMakefile::GetExecutionContext(cmListFileContext *__return_storage_ptr__,cmMakefile *this)

{
  string local_58;
  undefined1 local_21;
  cmListFileContext *local_20;
  cmListFileContext *cur;
  cmMakefile *this_local;
  cmListFileContext *lfc;
  
  cur = (cmListFileContext *)this;
  this_local = (cmMakefile *)__return_storage_ptr__;
  local_20 = cmListFileBacktrace::Top(&this->Backtrace);
  local_21 = 0;
  cmListFileContext::cmListFileContext(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_20);
  __return_storage_ptr__->Line = local_20->Line;
  cmStateSnapshot::GetExecutionListFile_abi_cxx11_(&local_58,&this->StateSnapshot);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->FilePath,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

cmListFileContext cmMakefile::GetExecutionContext() const
{
  cmListFileContext const& cur = this->Backtrace.Top();
  cmListFileContext lfc;
  lfc.Name = cur.Name;
  lfc.Line = cur.Line;
  lfc.FilePath = this->StateSnapshot.GetExecutionListFile();
  return lfc;
}